

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonString.h
# Opt level: O2

Data * __thiscall Json::JsonString::data(Data *__return_storage_ptr__,JsonString *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->__str);
  __return_storage_ptr__->data2 = 0.0;
  __return_storage_ptr__->data3 = false;
  return __return_storage_ptr__;
}

Assistant:

Data data() const override { return Data{__str}; }